

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

int lws_hdr_copy(lws *wsi,char *dst,int len,lws_token_indexes h)

{
  ushort uVar1;
  allocated_headers *paVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  paVar2 = (wsi->http).ah;
  iVar5 = 0;
  if (paVar2 != (allocated_headers *)0x0) {
    bVar3 = paVar2->frag_index[h];
    iVar5 = 0;
    if (bVar3 != 0) {
      iVar4 = 0;
      do {
        iVar5 = (uint)paVar2->frags[bVar3].len + iVar4;
        bVar3 = paVar2->frags[bVar3].nfrag;
        iVar4 = (uint)(bVar3 != 0 && h != WSI_TOKEN_HTTP_COOKIE) + iVar5;
      } while (bVar3 != 0);
      *dst = '\0';
      if (iVar5 == 0) {
        return 0;
      }
      if ((len <= iVar5) || (paVar2 = (wsi->http).ah, paVar2 == (allocated_headers *)0x0)) {
        return -1;
      }
      bVar3 = paVar2->frag_index[h];
      if (bVar3 == 0) {
        return 0;
      }
      do {
        paVar2 = (wsi->http).ah;
        bVar6 = paVar2->frags[bVar3].nfrag != '\0';
        uVar1 = paVar2->frags[bVar3].len;
        if (len <= (int)((uint)(bVar6 && h != WSI_TOKEN_HTTP_COOKIE) + (uint)uVar1)) {
          return -1;
        }
        strncpy(dst,paVar2->data + paVar2->frags[bVar3].offset,(ulong)uVar1);
        paVar2 = (wsi->http).ah;
        uVar1 = paVar2->frags[bVar3].len;
        dst = dst + uVar1;
        bVar3 = paVar2->frags[bVar3].nfrag;
        if (bVar6 && h != WSI_TOKEN_HTTP_COOKIE) {
          *dst = ',';
          dst = dst + 1;
        }
        len = len - (uint)uVar1;
      } while (bVar3 != 0);
    }
  }
  *dst = '\0';
  return iVar5;
}

Assistant:

int lws_hdr_copy(struct lws *wsi, char *dst, int len,
			     enum lws_token_indexes h)
{
	int toklen = lws_hdr_total_length(wsi, h);
	int n;
	int comma;

	*dst = '\0';
	if (!toklen)
		return 0;

	if (toklen >= len)
		return -1;

	if (!wsi->http.ah)
		return -1;

	n = wsi->http.ah->frag_index[h];
	if (!n)
		return 0;

	do {
		comma = (wsi->http.ah->frags[n].nfrag &&
			h != WSI_TOKEN_HTTP_COOKIE) ? 1 : 0;

		if (wsi->http.ah->frags[n].len + comma >= len)
			return -1;
		strncpy(dst, &wsi->http.ah->data[wsi->http.ah->frags[n].offset],
		        wsi->http.ah->frags[n].len);
		dst += wsi->http.ah->frags[n].len;
		len -= wsi->http.ah->frags[n].len;
		n = wsi->http.ah->frags[n].nfrag;

		if (comma)
			*dst++ = ',';
				
	} while (n);
	*dst = '\0';

	return toklen;
}